

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

llb_build_key_t * llb_build_key_make_custom_task(char *name,char *taskData)

{
  CAPIBuildKey *this;
  StringRef local_78;
  StringRef local_68;
  BuildKey local_58;
  char *local_38;
  char *taskData_local;
  char *name_local;
  StringRef *local_20;
  char *local_18;
  StringRef *local_10;
  
  local_38 = taskData;
  taskData_local = name;
  this = (CAPIBuildKey *)operator_new(0x38);
  local_20 = &local_68;
  name_local = taskData_local;
  local_68.Data = taskData_local;
  if (taskData_local != (char *)0x0) {
    strlen(taskData_local);
  }
  local_10 = &local_78;
  local_18 = local_38;
  local_78.Data = local_38;
  if (local_38 != (char *)0x0) {
    strlen(local_38);
  }
  llbuild::buildsystem::BuildKey::makeCustomTask(&local_58,local_68,local_78);
  anon_unknown.dwarf_1e10c2::CAPIBuildKey::CAPIBuildKey(this,&local_58);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_58);
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_custom_task(const char *name, const char *taskData) {
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeCustomTask(StringRef(name), StringRef(taskData)));
}